

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void process_player_input_fire(tgestate_t *state,input_t input)

{
  byte bVar1;
  uint8_t uVar2;
  int iVar3;
  ulong uVar4;
  doorindex_t *pdVar5;
  byte bVar6;
  long lVar7;
  char cVar8;
  wall_t *pwVar9;
  
  switch(input) {
  case 10:
    pick_up_item(state);
    return;
  case 0xb:
    drop_item(state);
    return;
  case 0xc:
    bVar6 = state->items_held[0];
    break;
  default:
    goto switchD_00105f5e_caseD_d;
  case 0xf:
    bVar6 = state->items_held[1];
  }
  uVar4 = (ulong)bVar6;
  if (uVar4 != 0xff) {
    (state->saved_mappos).pos16.w = state->vischars[0].mi.mappos.w;
    *(undefined4 *)&state->saved_mappos = *(undefined4 *)&state->vischars[0].mi.mappos;
    if ((0xe090UL >> (uVar4 & 0x3f) & 1) == 0) {
      switch(uVar4) {
      case 0:
        bVar6 = (state->hero_mappos).v;
        lVar7 = 0x10f1b8;
        cVar8 = -4;
        break;
      case 1:
        if ((state->room_index == '2') && (iVar3 = get_roomdef(state,'2',2), iVar3 != 0xff)) {
          set_roomdef(state,'2',2,0xff);
          set_roomdef(state,'2',0x17,0);
          setup_room(state);
          choose_game_window_attributes(state);
          plot_interior_tiles(state);
          bVar6 = 0x66;
          if (state->morale < 0x66) {
            bVar6 = state->morale;
          }
          state->morale = bVar6 + 10;
          increase_score(state,'2');
          return;
        }
        return;
      case 2:
        pdVar5 = get_nearest_door(state);
        if (pdVar5 == (doorindex_t *)0x0) {
          return;
        }
        state->ptr_to_door_being_lockpicked = pdVar5;
        state->player_locked_out_until = state->game_counter + 0xff;
        state->vischars[0].flags = '\x01';
        queue_message(state,message_PICKING_THE_LOCK);
        return;
      case 3:
        if ((0xfb < (byte)((state->hero_mappos).u + 0x93)) &&
           (0xfd < (byte)((state->hero_mappos).v + 0xb5))) {
          if (state->vischars[0].mi.sprite == sprites + 0x16) {
            bVar6 = 0x66;
            if (state->morale < 0x66) {
              bVar6 = state->morale;
            }
            state->morale = bVar6 + 10;
            increase_score(state,'2');
            state->vischars[0].room = '\0';
            state->IY = state->vischars;
            transition(state,&action_papers::outside_main_gate);
            return;
          }
          solitary(state);
          return;
        }
        return;
      }
      do {
        if ((bVar6 < *(byte *)(lVar7 + 2)) || (*(byte *)(lVar7 + 3) <= bVar6)) {
LAB_001061c3:
          lVar7 = lVar7 + 6;
          iVar3 = 0;
        }
        else {
          bVar1 = (state->hero_mappos).u;
          iVar3 = 4;
          if ((bVar1 != *(byte *)(lVar7 + 1)) &&
             (iVar3 = 5, bVar1 - 1 != (uint)*(byte *)(lVar7 + 1))) goto LAB_001061c3;
        }
        if (iVar3 != 0) {
          if (iVar3 == 1) {
            return;
          }
          if (iVar3 == 4) {
            uVar2 = '\x04';
          }
          else {
            uVar2 = '\x06';
          }
          goto LAB_0010622b;
        }
        cVar8 = cVar8 + '\x01';
      } while (cVar8 != '\0');
      bVar1 = (state->hero_mappos).u;
      pwVar9 = walls + 0x10;
      cVar8 = -3;
      do {
        if ((bVar1 < pwVar9->minx) || (pwVar9->maxx <= bVar1)) {
LAB_00106208:
          pwVar9 = pwVar9 + 1;
          iVar3 = 0;
        }
        else {
          iVar3 = 8;
          if ((bVar6 != pwVar9->miny) && (iVar3 = 9, bVar6 - 1 != (uint)pwVar9->miny))
          goto LAB_00106208;
        }
        if (iVar3 != 0) {
          if (iVar3 == 1) {
            return;
          }
          if (iVar3 == 8) {
            uVar2 = '\x05';
          }
          else {
            uVar2 = '\a';
          }
LAB_0010622b:
          state->vischars[0].direction = uVar2;
          state->vischars[0].input = 0x80;
          state->vischars[0].flags = '\x02';
          state->vischars[0].mi.mappos.w = 0xc;
          state->vischars[0].mi.sprite = sprites + 2;
          state->player_locked_out_until = state->game_counter + '`';
          queue_message(state,message_CUTTING_THE_WIRE);
          return;
        }
        cVar8 = cVar8 + '\x01';
        if (cVar8 == '\0') {
          return;
        }
      } while( true );
    }
  }
switchD_00105f5e_caseD_d:
  return;
}

Assistant:

void process_player_input_fire(tgestate_t *state, input_t input)
{
  assert(state != NULL);

  switch (input)
  {
  case input_UP_FIRE:
    pick_up_item(state);
    break;
  case input_DOWN_FIRE:
    drop_item(state);
    break;
  case input_LEFT_FIRE:
    use_item_common(state, state->items_held[0]); /* Conv: Inlined. */
    break;
  case input_RIGHT_FIRE:
    use_item_common(state, state->items_held[1]); /* Conv: Inlined. */
    break;
  case input_FIRE:
  default:
    break;
  }

  return;
}